

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
DisarmBeaconIRCCommand::trigger
          (DisarmBeaconIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Channel *pCVar1;
  DisarmBeaconIRCCommand *pDVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  size_t local_198;
  char *local_190;
  size_t local_178;
  char *local_170;
  size_t local_158;
  basic_string_view<char,_std::char_traits<char>_> *local_150;
  size_t local_138;
  basic_string_view<char,_std::char_traits<char>_> *local_130;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [32];
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [24];
  _Alloc_hider _Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  Server *server;
  uint i;
  bool match;
  PlayerInfo *player;
  _Alloc_hider _Stack_50;
  int type;
  char *local_48;
  undefined1 local_40 [8];
  Channel *chan;
  IRC_Bot *source_local;
  DisarmBeaconIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  local_150 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_len;
  pcVar8 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  chan = (Channel *)source;
  source_local = (IRC_Bot *)this;
  this_local = (DisarmBeaconIRCCommand *)local_150;
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  sVar3 = nick_local._M_len;
  pDVar2 = this_local;
  pCVar1 = chan;
  if (bVar5) {
    bVar9 = sv("Error: Too Few Parameters. Syntax: disarmb <player>",0x33);
    local_198 = bVar9._M_len;
    local_190 = bVar9._M_str;
    Jupiter::IRC::Client::sendNotice(pCVar1,pDVar2,sVar3,local_198,local_190);
  }
  else {
    _Stack_50._M_p = nick_local._M_str;
    local_48 = pcVar8;
    local_40 = (undefined1  [8])Jupiter::IRC::Client::getChannel(chan,nick_local._M_str,pcVar8);
    if (local_40 != (undefined1  [8])0x0) {
      player._4_4_ = Jupiter::IRC::Client::Channel::getType();
      server._7_1_ = 0;
      server._0_4_ = 0;
      while( true ) {
        uVar7 = (ulong)(uint)server;
        RenX::getCore();
        uVar6 = RenX::Core::getServerCount();
        sVar3 = nick_local._M_len;
        pDVar2 = this_local;
        pCVar1 = chan;
        if (uVar7 == uVar6) break;
        uVar7 = RenX::getCore();
        local_70._M_p = (pointer)RenX::Core::getServer(uVar7);
        uVar7 = RenX::Server::isLogChanType((int)local_70._M_p);
        if ((uVar7 & 1) != 0) {
          server._7_1_ = 1;
          local_80._M_allocated_capacity = parameters._M_len;
          local_80._8_8_ = parameters._M_str;
          _i = RenX::Server::getPlayerByPartName(local_70._M_p,parameters._M_len,parameters._M_str);
          sVar3 = nick_local._M_len;
          pDVar2 = this_local;
          pCVar1 = chan;
          if (_i == 0) {
            bVar9 = sv("Error: Player not found.",0x18);
            local_158 = bVar9._M_len;
            local_150 = (basic_string_view<char,_std::char_traits<char>_> *)bVar9._M_str;
            Jupiter::IRC::Client::sendNotice(pCVar1,pDVar2,sVar3,local_158);
          }
          else {
            uVar7 = RenX::Server::disarmBeacon((PlayerInfo *)local_70._M_p);
            pcVar4 = nick_local._M_str;
            pCVar1 = chan;
            if ((uVar7 & 1) == 0) {
              bVar9 = sv("Error: Server does not support disarms.",0x27);
              local_138 = bVar9._M_len;
              local_130 = (basic_string_view<char,_std::char_traits<char>_> *)bVar9._M_str;
              Jupiter::IRC::Client::sendMessage(pCVar1,pcVar4,pcVar8,local_138);
              local_150 = local_130;
            }
            else {
              local_a8._16_8_ = nick_local._M_str;
              _Stack_90._M_p = pcVar8;
              local_d8 = sv("All beacons belonging to ",0x19);
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)local_f8);
              local_108 = sv("\x03 have been disarmed.",0x15);
              jessilib::
              join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f8 + 0x30),(jessilib *)(local_f8 + 0x20),
                         (basic_string_view<char,_std::char_traits<char>_> *)local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_108,local_150);
              local_a8._0_16_ =
                   (undefined1  [16])
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(local_f8 + 0x30));
              local_150 = (basic_string_view<char,_std::char_traits<char>_> *)local_a8._8_8_;
              Jupiter::IRC::Client::sendMessage
                        (pCVar1,local_a8._16_8_,_Stack_90._M_p,local_a8._0_8_);
              std::__cxx11::string::~string((string *)(local_f8 + 0x30));
              std::__cxx11::string::~string((string *)local_f8);
            }
          }
        }
        server._0_4_ = (uint)server + 1;
      }
      if ((server._7_1_ & 1) == 0) {
        bVar9 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_178 = bVar9._M_len;
        local_170 = bVar9._M_str;
        Jupiter::IRC::Client::sendNotice(pCVar1,pDVar2,sVar3,local_178,local_170);
      }
    }
  }
  return;
}

Assistant:

void DisarmBeaconIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						if (server->disarmBeacon(*player))
							source->sendMessage(channel, jessilib::join<std::string>("All beacons belonging to "sv, RenX::getFormattedPlayerName(*player), IRCCOLOR " have been disarmed."sv));
						else
							source->sendMessage(channel, "Error: Server does not support disarms."sv);
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: disarmb <player>"sv);
}